

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSetupColumnFlags
               (ImGuiTable *table,ImGuiTableColumn *column,ImGuiTableColumnFlags flags_in)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  byte local_30;
  int list;
  int mask;
  int count;
  ImGuiTableFlags table_sizing_policy;
  ImGuiTableColumnFlags flags;
  ImGuiTableColumnFlags flags_in_local;
  ImGuiTableColumn *column_local;
  ImGuiTable *table_local;
  
  if ((flags_in & 0x18U) == 0) {
    uVar3 = table->Flags & 0xe000;
    if ((uVar3 == 0x2000) || (uVar3 == 0x4000)) {
      count = flags_in | 0x10;
    }
    else {
      count = flags_in | 8;
    }
  }
  else {
    bVar1 = ImIsPowerOfTwo(flags_in & 0x18);
    count = flags_in;
    if (!bVar1) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                    ,0x29e,
                    "void TableSetupColumnFlags(ImGuiTable *, ImGuiTableColumn *, ImGuiTableColumnFlags)"
                   );
    }
  }
  if ((table->Flags & 1U) == 0) {
    count = count | 0x20;
  }
  if (((count & 0x400U) != 0) && ((count & 0x800U) != 0)) {
    count = count | 0x200;
  }
  if ((count & 0x30000U) == 0) {
    iVar4 = ImSpan<ImGuiTableColumn>::index_from_ptr(&table->Columns,column);
    uVar3 = 0x20000;
    if (iVar4 == 0) {
      uVar3 = 0x10000;
    }
    count = uVar3 | count;
  }
  column->Flags = count | column->Flags & 0xf000000U;
  column->SortDirectionsAvailList = '\0';
  column->field_0x65 = column->field_0x65 & 0xf;
  column->field_0x65 = column->field_0x65 & 0xf3;
  if ((table->Flags & 8U) != 0) {
    list = 0;
    bVar2 = 0;
    local_30 = 0;
    if (((count & 0x4000U) != 0) && ((count & 0x400U) == 0)) {
      bVar2 = 2;
      local_30 = 1;
      list = 1;
    }
    if (((count & 0x8000U) != 0) && ((count & 0x800U) == 0)) {
      bVar2 = bVar2 | 4;
      local_30 = (byte)(2 << (sbyte)(list << 1)) | local_30;
      list = list + 1;
    }
    if (((count & 0x4000U) == 0) && ((count & 0x400U) == 0)) {
      bVar2 = bVar2 | 2;
      local_30 = (byte)(1 << (sbyte)(list << 1)) | local_30;
      list = list + 1;
    }
    if (((count & 0x8000U) == 0) && ((count & 0x800U) == 0)) {
      bVar2 = bVar2 | 4;
      local_30 = (byte)(2 << (sbyte)(list << 1)) | local_30;
      list = list + 1;
    }
    if (((table->Flags & 0x8000000U) != 0) || (list == 0)) {
      bVar2 = bVar2 | 1;
      list._0_1_ = (byte)list + 1;
    }
    column->SortDirectionsAvailList = local_30;
    column->field_0x65 = column->field_0x65 & 0xf | bVar2 << 4;
    column->field_0x65 = column->field_0x65 & 0xf3 | ((byte)list & 3) << 2;
    ImGui::TableFixColumnSortDirection(table,column);
  }
  return;
}

Assistant:

static void TableSetupColumnFlags(ImGuiTable* table, ImGuiTableColumn* column, ImGuiTableColumnFlags flags_in)
{
    ImGuiTableColumnFlags flags = flags_in;

    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
        if (table_sizing_policy == ImGuiTableFlags_SizingFixedFit || table_sizing_policy == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    else
    {
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    }

    // Resize
    if ((table->Flags & ImGuiTableFlags_Resizable) == 0)
        flags |= ImGuiTableColumnFlags_NoResize;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Indentation
    if ((flags & ImGuiTableColumnFlags_IndentMask_) == 0)
        flags |= (table->Columns.index_from_ptr(column) == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    // Preserve status flags
    column->Flags = flags | (column->Flags & ImGuiTableColumnFlags_StatusMask_);

    // Build an ordered list of available sort directions
    column->SortDirectionsAvailCount = column->SortDirectionsAvailMask = column->SortDirectionsAvailList = 0;
    if (table->Flags & ImGuiTableFlags_Sortable)
    {
        int count = 0, mask = 0, list = 0;
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  != 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) != 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  == 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) == 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((table->Flags & ImGuiTableFlags_SortTristate) || count == 0) { mask |= 1 << ImGuiSortDirection_None; count++; }
        column->SortDirectionsAvailList = (ImU8)list;
        column->SortDirectionsAvailMask = (ImU8)mask;
        column->SortDirectionsAvailCount = (ImU8)count;
        ImGui::TableFixColumnSortDirection(table, column);
    }
}